

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStore.cpp
# Opt level: O2

ObjectStoreToken * __thiscall ObjectStore::newToken(ObjectStore *this,ByteString *label)

{
  ObjectStoreToken *pOVar1;
  ObjectStoreToken *newToken;
  ByteString serial;
  string tokenUUID;
  MutexLocker lock;
  string serialNumber;
  string local_50;
  string local_30;
  
  MutexLocker::MutexLocker(&lock,this->storeMutex);
  UUID::newUUID_abi_cxx11_();
  std::__cxx11::string::substr((ulong)&serial,(ulong)&tokenUUID);
  std::__cxx11::string::substr((ulong)&newToken,(ulong)&tokenUUID);
  std::operator+(&serialNumber,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&serial,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newToken);
  std::__cxx11::string::~string((string *)&newToken);
  std::__cxx11::string::~string((string *)&serial);
  ByteString::ByteString
            (&serial,(uchar *)serialNumber._M_dataplus._M_p,serialNumber._M_string_length);
  std::__cxx11::string::string((string *)&local_30,(string *)&this->storePath);
  std::__cxx11::string::string((string *)&local_50,(string *)&tokenUUID);
  pOVar1 = ObjectStoreToken::createToken(&local_30,&local_50,this->umask,label,&serial);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  newToken = pOVar1;
  if (pOVar1 == (ObjectStoreToken *)0x0) {
    pOVar1 = (ObjectStoreToken *)0x0;
  }
  else {
    std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::push_back
              (&this->tokens,&newToken);
    std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::push_back
              (&this->allTokens,&newToken);
    pOVar1 = newToken;
  }
  ByteString::~ByteString(&serial);
  std::__cxx11::string::~string((string *)&serialNumber);
  std::__cxx11::string::~string((string *)&tokenUUID);
  MutexLocker::~MutexLocker(&lock);
  return pOVar1;
}

Assistant:

ObjectStoreToken* ObjectStore::newToken(const ByteString& label)
{
	MutexLocker lock(storeMutex);

	// Generate a UUID for the token
	std::string tokenUUID = UUID::newUUID();

	// Convert the UUID to a serial number
	std::string serialNumber = tokenUUID.substr(19, 4) + tokenUUID.substr(24);
	ByteString serial((const unsigned char*) serialNumber.c_str(), serialNumber.size());

	// Create the token
	ObjectStoreToken* newToken = ObjectStoreToken::createToken(storePath, tokenUUID, umask, label, serial);

	if (newToken != NULL)
	{
		tokens.push_back(newToken);
		allTokens.push_back(newToken);
	}

	return newToken;
}